

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int open_get_max_frame_size(OPEN_HANDLE open,uint32_t *max_frame_size_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  
  item_count = (uint32_t)((ulong)in_RAX >> 0x20);
  if (open == (OPEN_HANDLE)0x0) {
    return 0x4fd;
  }
  iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&item_count);
  if (iVar1 != 0) {
    return 0x505;
  }
  if (((2 < item_count) &&
      (value = amqpvalue_get_composite_item_in_place(open->composite_value,2),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_uint(value,max_frame_size_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x51e;
    }
  }
  *max_frame_size_value = 0xffffffff;
  return 0;
}

Assistant:

int open_get_max_frame_size(OPEN_HANDLE open, uint32_t* max_frame_size_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                *max_frame_size_value = 4294967295u;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *max_frame_size_value = 4294967295u;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_uint(item_value, max_frame_size_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *max_frame_size_value = 4294967295u;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}